

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O3

LogEntry * __thiscall BuildLog::LookupByOutput(BuildLog *this,string *path)

{
  iterator iVar1;
  LogEntry *pLVar2;
  key_type local_10;
  
  local_10.str_ = (path->_M_dataplus)._M_p;
  local_10.len_ = path->_M_string_length;
  iVar1 = std::
          _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_10);
  if (iVar1.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>.
      _M_cur == (__node_type *)0x0) {
    pLVar2 = (LogEntry *)0x0;
  }
  else {
    pLVar2 = *(LogEntry **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                     ._M_cur + 0x18);
  }
  return pLVar2;
}

Assistant:

BuildLog::LogEntry* BuildLog::LookupByOutput(const string& path) {
  Entries::iterator i = entries_.find(path);
  if (i != entries_.end())
    return i->second;
  return NULL;
}